

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<std::vector<NodeView,_std::allocator<NodeView>_>,_std::unique_ptr<std::vector<NodeView,_std::allocator<NodeView>_>,_std::default_delete<std::vector<NodeView,_std::allocator<NodeView>_>_>_>_>
* __thiscall
pybind11::class_<std::vector<NodeView,std::allocator<NodeView>>,std::unique_ptr<std::
vector<NodeView,std::allocator<NodeView>>,std::default_delete<std::vector<NodeView,std::
allocator<NodeView>>>>>::def<bool(*)(std::vector<NodeView,std::allocator<NodeView>>const&,std::
vector<NodeView,std::allocator<NodeView>>const&),pybind11::operator>
          (class_<std::vector<NodeView,_std::allocator<NodeView>_>,_std::unique_ptr<std::vector<NodeView,_std::allocator<NodeView>_>,_std::default_delete<std::vector<NodeView,_std::allocator<NodeView>_>_>_>_>
           *this,char *name_,
          _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
          **f,is_operator *extra)

{
  _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
  **pp_Var1;
  _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
  **in_RDX;
  char *in_RSI;
  handle *in_RDI;
  cpp_function *in_stack_00000030;
  char *in_stack_00000038;
  object *in_stack_00000040;
  cpp_function cf;
  handle *value;
  none *in_stack_ffffffffffffff90;
  is_operator *in_stack_ffffffffffffff98;
  handle in_stack_ffffffffffffffa0;
  handle extra_1;
  PyObject *extra_00;
  _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
  *in_stack_ffffffffffffffb8;
  cpp_function *in_stack_ffffffffffffffc0;
  is_method local_38;
  name local_30 [4];
  char *local_10;
  
  local_10 = in_RSI;
  pp_Var1 = method_adaptor<std::vector<NodeView,std::allocator<NodeView>>,bool(*)(std::vector<NodeView,std::allocator<NodeView>>const&,std::vector<NodeView,std::allocator<NodeView>>const&)>
                      (in_RDX);
  value = (handle *)*pp_Var1;
  pybind11::name::name(local_30,local_10);
  is_method::is_method(&local_38,in_RDI);
  extra_00 = (((generic_type *)&in_RDI->m_ptr)->super_object).super_handle.m_ptr;
  none::none(in_stack_ffffffffffffff90);
  extra_1.m_ptr = in_stack_ffffffffffffffa0.m_ptr;
  getattr(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  sibling::sibling((sibling *)in_RDI,value);
  cpp_function::cpp_function<bool,std::vector<NodeView,std::allocator<NodeView>>const&,std::
  vector<NodeView,std::allocator<NodeView>>const&,pybind11::name,pybind11::is_method,pybind11::
  sibling,pybind11::operator>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(name *)extra_00,
             (is_method *)extra_1.m_ptr,(sibling *)in_stack_ffffffffffffffa0.m_ptr,
             in_stack_ffffffffffffff98);
  object::~object((object *)0x36d2cf);
  none::~none((none *)0x36d2d9);
  pybind11::detail::add_class_method(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  cpp_function::~cpp_function((cpp_function *)0x36d2f9);
  return (class_<std::vector<NodeView,_std::allocator<NodeView>_>,_std::unique_ptr<std::vector<NodeView,_std::allocator<NodeView>_>,_std::default_delete<std::vector<NodeView,_std::allocator<NodeView>_>_>_>_>
          *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }